

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyFormatter.h
# Opt level: O2

void __thiscall
Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
basic_formatter<char_const*>
          (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this,char **sin)

{
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,*sin);
  return;
}

Assistant:

basic_formatter(const TT& sin)  {
        underlying << sin;
    }